

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5ConfigSetValue(Fts5Config *pConfig,char *zKey,sqlite3_value *pVal,int *pbBadkey)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  i64 iVar5;
  char *zIn;
  uint uVar6;
  long lVar7;
  char *zRankArgs;
  char *zRank;
  char *local_28;
  char *local_20;
  
  if (zKey != (char *)0x0) {
    lVar7 = 0;
    do {
      bVar1 = zKey[lVar7];
      if (bVar1 == "pgsz"[lVar7]) {
        if ((ulong)bVar1 == 0) goto LAB_001c8a17;
      }
      else if (""[bVar1] != ""[(byte)"pgsz"[lVar7]]) {
        if (zKey == (char *)0x0) break;
        lVar7 = 0;
        goto LAB_001c8a5a;
      }
      lVar7 = lVar7 + 1;
    } while( true );
  }
LAB_001c8c84:
  *pbBadkey = 1;
  return 0;
LAB_001c8a5a:
  bVar1 = zKey[lVar7];
  if (bVar1 == "hashsize"[lVar7]) {
    if ((ulong)bVar1 == 0) goto LAB_001c8a7e;
  }
  else if (""[bVar1] != ""[(byte)"hashsize"[lVar7]]) {
    if (zKey == (char *)0x0) goto LAB_001c8c84;
    lVar7 = 0;
    goto LAB_001c8abf;
  }
  lVar7 = lVar7 + 1;
  goto LAB_001c8a5a;
LAB_001c8abf:
  bVar1 = zKey[lVar7];
  if (bVar1 == "automerge"[lVar7]) {
    if ((ulong)bVar1 == 0) goto LAB_001c8ae3;
  }
  else if (""[bVar1] != ""[(byte)"automerge"[lVar7]]) {
    if (zKey == (char *)0x0) goto LAB_001c8c84;
    lVar7 = 0;
    goto LAB_001c8b30;
  }
  lVar7 = lVar7 + 1;
  goto LAB_001c8abf;
LAB_001c8b30:
  bVar1 = zKey[lVar7];
  if (bVar1 == "usermerge"[lVar7]) {
    if ((ulong)bVar1 == 0) goto LAB_001c8b54;
  }
  else if (""[bVar1] != ""[(byte)"usermerge"[lVar7]]) {
    if (zKey == (char *)0x0) goto LAB_001c8c84;
    lVar7 = 0;
    goto LAB_001c8b99;
  }
  lVar7 = lVar7 + 1;
  goto LAB_001c8b30;
LAB_001c8b99:
  bVar1 = zKey[lVar7];
  if (bVar1 == "crisismerge"[lVar7]) {
    if ((ulong)bVar1 == 0) goto LAB_001c8bbd;
  }
  else if (""[bVar1] != ""[(byte)"crisismerge"[lVar7]]) {
    if (zKey == (char *)0x0) goto LAB_001c8c84;
    lVar7 = 0;
    goto LAB_001c8c09;
  }
  lVar7 = lVar7 + 1;
  goto LAB_001c8b99;
LAB_001c8c09:
  bVar1 = zKey[lVar7];
  if (bVar1 == "rank"[lVar7]) {
    if ((ulong)bVar1 == 0) goto LAB_001c8c2d;
  }
  else if (""[bVar1] != ""[(byte)"rank"[lVar7]]) goto LAB_001c8c84;
  lVar7 = lVar7 + 1;
  goto LAB_001c8c09;
LAB_001c8c2d:
  zIn = (char *)sqlite3ValueText(pVal,'\x01');
  iVar2 = sqlite3Fts5ConfigParseRank(zIn,&local_20,&local_28);
  if (iVar2 != 1) {
    if (iVar2 == 0) {
      sqlite3_free(pConfig->zRank);
      sqlite3_free(pConfig->zRankArgs);
      pConfig->zRank = local_20;
      pConfig->zRankArgs = local_28;
      return 0;
    }
    return iVar2;
  }
  goto LAB_001c8c84;
LAB_001c8bbd:
  iVar2 = sqlite3_value_numeric_type(pVal);
  iVar3 = -1;
  if (iVar2 == 1) {
    iVar5 = sqlite3VdbeIntValue(pVal);
    iVar3 = (int)iVar5;
  }
  if (-1 < iVar3) {
    iVar2 = 0x10;
    if (1 < iVar3) {
      iVar2 = iVar3;
    }
    pConfig->nCrisisMerge = iVar2;
    return 0;
  }
  goto LAB_001c8c84;
LAB_001c8b54:
  iVar2 = sqlite3_value_numeric_type(pVal);
  iVar3 = -1;
  if (iVar2 == 1) {
    iVar5 = sqlite3VdbeIntValue(pVal);
    iVar3 = (int)iVar5;
  }
  if (0xfffffff0 < iVar3 - 0x11U) {
    pConfig->nUsermerge = iVar3;
    return 0;
  }
  goto LAB_001c8c84;
LAB_001c8ae3:
  iVar2 = sqlite3_value_numeric_type(pVal);
  uVar4 = 0xffffffff;
  if (iVar2 == 1) {
    iVar5 = sqlite3VdbeIntValue(pVal);
    uVar4 = (uint)iVar5;
  }
  if (uVar4 < 0x41) {
    uVar6 = 4;
    if (uVar4 != 1) {
      uVar6 = uVar4;
    }
    pConfig->nAutomerge = uVar6;
    return 0;
  }
  goto LAB_001c8c84;
LAB_001c8a7e:
  iVar2 = sqlite3_value_numeric_type(pVal);
  iVar3 = -1;
  if (iVar2 == 1) {
    iVar5 = sqlite3VdbeIntValue(pVal);
    iVar3 = (int)iVar5;
  }
  if (0 < iVar3) {
    pConfig->nHashSize = iVar3;
    return 0;
  }
  goto LAB_001c8c84;
LAB_001c8a17:
  iVar2 = sqlite3_value_numeric_type(pVal);
  iVar3 = 0;
  if (iVar2 == 1) {
    iVar5 = sqlite3VdbeIntValue(pVal);
    iVar3 = (int)iVar5;
  }
  if (0xfffdffff < iVar3 - 0x20001U) {
    pConfig->pgsz = iVar3;
    return 0;
  }
  goto LAB_001c8c84;
}

Assistant:

static int sqlite3Fts5ConfigSetValue(
  Fts5Config *pConfig, 
  const char *zKey, 
  sqlite3_value *pVal,
  int *pbBadkey
){
  int rc = SQLITE_OK;

  if( 0==sqlite3_stricmp(zKey, "pgsz") ){
    int pgsz = 0;
    if( SQLITE_INTEGER==sqlite3_value_numeric_type(pVal) ){
      pgsz = sqlite3_value_int(pVal);
    }
    if( pgsz<=0 || pgsz>FTS5_MAX_PAGE_SIZE ){
      *pbBadkey = 1;
    }else{
      pConfig->pgsz = pgsz;
    }
  }

  else if( 0==sqlite3_stricmp(zKey, "hashsize") ){
    int nHashSize = -1;
    if( SQLITE_INTEGER==sqlite3_value_numeric_type(pVal) ){
      nHashSize = sqlite3_value_int(pVal);
    }
    if( nHashSize<=0 ){
      *pbBadkey = 1;
    }else{
      pConfig->nHashSize = nHashSize;
    }
  }

  else if( 0==sqlite3_stricmp(zKey, "automerge") ){
    int nAutomerge = -1;
    if( SQLITE_INTEGER==sqlite3_value_numeric_type(pVal) ){
      nAutomerge = sqlite3_value_int(pVal);
    }
    if( nAutomerge<0 || nAutomerge>64 ){
      *pbBadkey = 1;
    }else{
      if( nAutomerge==1 ) nAutomerge = FTS5_DEFAULT_AUTOMERGE;
      pConfig->nAutomerge = nAutomerge;
    }
  }

  else if( 0==sqlite3_stricmp(zKey, "usermerge") ){
    int nUsermerge = -1;
    if( SQLITE_INTEGER==sqlite3_value_numeric_type(pVal) ){
      nUsermerge = sqlite3_value_int(pVal);
    }
    if( nUsermerge<2 || nUsermerge>16 ){
      *pbBadkey = 1;
    }else{
      pConfig->nUsermerge = nUsermerge;
    }
  }

  else if( 0==sqlite3_stricmp(zKey, "crisismerge") ){
    int nCrisisMerge = -1;
    if( SQLITE_INTEGER==sqlite3_value_numeric_type(pVal) ){
      nCrisisMerge = sqlite3_value_int(pVal);
    }
    if( nCrisisMerge<0 ){
      *pbBadkey = 1;
    }else{
      if( nCrisisMerge<=1 ) nCrisisMerge = FTS5_DEFAULT_CRISISMERGE;
      pConfig->nCrisisMerge = nCrisisMerge;
    }
  }

  else if( 0==sqlite3_stricmp(zKey, "rank") ){
    const char *zIn = (const char*)sqlite3_value_text(pVal);
    char *zRank;
    char *zRankArgs;
    rc = sqlite3Fts5ConfigParseRank(zIn, &zRank, &zRankArgs);
    if( rc==SQLITE_OK ){
      sqlite3_free(pConfig->zRank);
      sqlite3_free(pConfig->zRankArgs);
      pConfig->zRank = zRank;
      pConfig->zRankArgs = zRankArgs;
    }else if( rc==SQLITE_ERROR ){
      rc = SQLITE_OK;
      *pbBadkey = 1;
    }
  }else{
    *pbBadkey = 1;
  }
  return rc;
}